

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools.cpp
# Opt level: O0

AbstractTool * CreateTool(string *arg)

{
  __type _Var1;
  IndexTool *in_stack_000001c0;
  HeaderTool *in_stack_00000220;
  CoverageTool *in_stack_00000240;
  StatsTool *in_stack_000002c0;
  CountTool *in_stack_000002e0;
  RevertTool *in_stack_000003a0;
  MergeTool *in_stack_000003d0;
  SortTool *in_stack_000004a0;
  RandomTool *in_stack_000005e0;
  SplitTool *in_stack_00000680;
  ResolveTool *in_stack_00000820;
  FilterTool *in_stack_00001190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined8 local_8;
  
  _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (_Var1) {
    local_8 = (AbstractTool *)operator_new(0x18);
    BamTools::ConvertTool::ConvertTool((ConvertTool *)in_stack_00000680);
  }
  else {
    _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (_Var1) {
      local_8 = (AbstractTool *)operator_new(0x18);
      BamTools::CountTool::CountTool(in_stack_000002e0);
    }
    else {
      _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (_Var1) {
        local_8 = (AbstractTool *)operator_new(0x18);
        BamTools::CoverageTool::CoverageTool(in_stack_00000240);
      }
      else {
        _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        if (_Var1) {
          local_8 = (AbstractTool *)operator_new(0x18);
          BamTools::FilterTool::FilterTool(in_stack_00001190);
        }
        else {
          _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          if (_Var1) {
            local_8 = (AbstractTool *)operator_new(0x18);
            BamTools::HeaderTool::HeaderTool(in_stack_00000220);
          }
          else {
            _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
            if (_Var1) {
              local_8 = (AbstractTool *)operator_new(0x18);
              BamTools::IndexTool::IndexTool(in_stack_000001c0);
            }
            else {
              _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
              if (_Var1) {
                local_8 = (AbstractTool *)operator_new(0x18);
                BamTools::MergeTool::MergeTool(in_stack_000003d0);
              }
              else {
                _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
                if (_Var1) {
                  local_8 = (AbstractTool *)operator_new(0x18);
                  BamTools::RandomTool::RandomTool(in_stack_000005e0);
                }
                else {
                  _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
                  if (_Var1) {
                    local_8 = (AbstractTool *)operator_new(0x18);
                    BamTools::ResolveTool::ResolveTool(in_stack_00000820);
                  }
                  else {
                    _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
                    if (_Var1) {
                      local_8 = (AbstractTool *)operator_new(0x18);
                      BamTools::RevertTool::RevertTool(in_stack_000003a0);
                    }
                    else {
                      _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
                      if (_Var1) {
                        local_8 = (AbstractTool *)operator_new(0x18);
                        BamTools::SortTool::SortTool(in_stack_000004a0);
                      }
                      else {
                        _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
                        ;
                        if (_Var1) {
                          local_8 = (AbstractTool *)operator_new(0x18);
                          BamTools::SplitTool::SplitTool(in_stack_00000680);
                        }
                        else {
                          _Var1 = std::operator==(in_stack_ffffffffffffffa0,
                                                  in_stack_ffffffffffffff98);
                          if (_Var1) {
                            local_8 = (AbstractTool *)operator_new(0x18);
                            BamTools::StatsTool::StatsTool(in_stack_000002c0);
                          }
                          else {
                            local_8 = (AbstractTool *)0x0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

AbstractTool* CreateTool(const std::string& arg)
{

    // determine tool type based on arg
    if (arg == CONVERT) {
        return new ConvertTool;
    }
    if (arg == COUNT) {
        return new CountTool;
    }
    if (arg == COVERAGE) {
        return new CoverageTool;
    }
    if (arg == FILTER) {
        return new FilterTool;
    }
    if (arg == HEADER) {
        return new HeaderTool;
    }
    if (arg == INDEX) {
        return new IndexTool;
    }
    if (arg == MERGE) {
        return new MergeTool;
    }
    if (arg == RANDOM) {
        return new RandomTool;
    }
    if (arg == RESOLVE) {
        return new ResolveTool;
    }
    if (arg == REVERT) {
        return new RevertTool;
    }
    if (arg == SORT) {
        return new SortTool;
    }
    if (arg == SPLIT) {
        return new SplitTool;
    }
    if (arg == STATS) {
        return new StatsTool;
    }

    // unknown arg
    return 0;
}